

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O1

int stdin_checkfile(char *urltype,char *infile,char *outfile)

{
  stdin_outfile[0] = '\0';
  if (*outfile != '\0') {
    strncat(stdin_outfile,outfile,0x400);
    builtin_strncpy(urltype,"stdinfile://",0xd);
  }
  return 0;
}

Assistant:

int stdin_checkfile(char *urltype, char *infile, char *outfile)
/*
   do any special case checking when opening a file on the stdin stream
*/
{
    if (strlen(outfile))
    {
        stdin_outfile[0] = '\0';
        strncat(stdin_outfile,outfile,FLEN_FILENAME-1); /* an output file is specified */
	strcpy(urltype,"stdinfile://");
    }
    else
        *stdin_outfile = '\0';  /* no output file was specified */

    return(0);
}